

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O0

l_mem luaO_applyparam(lu_byte p,l_mem x)

{
  byte bVar1;
  undefined4 local_28;
  undefined4 local_24;
  int e;
  uint m;
  l_mem x_local;
  long lStack_10;
  lu_byte p_local;
  
  local_24 = p & 0xf;
  local_28 = (int)(uint)p >> 4;
  if (local_28 != 0) {
    local_28 = local_28 + -1;
    local_24 = local_24 + 0x10;
  }
  bVar1 = (byte)(local_28 + -7);
  if (local_28 + -7 < 0) {
    bVar1 = -bVar1;
    if (x < 0x421084210842108) {
      lStack_10 = (long)(x * (ulong)local_24) >> (bVar1 & 0x3f);
    }
    else if (x >> (bVar1 & 0x3f) < 0x421084210842108) {
      lStack_10 = (x >> (bVar1 & 0x3f)) * (ulong)local_24;
    }
    else {
      lStack_10 = 0x7fffffffffffffff;
    }
  }
  else if (x < 0x421084210842108 >> (bVar1 & 0x3f)) {
    lStack_10 = x * (ulong)local_24 << (bVar1 & 0x3f);
  }
  else {
    lStack_10 = 0x7fffffffffffffff;
  }
  return lStack_10;
}

Assistant:

l_mem luaO_applyparam (lu_byte p, l_mem x) {
  unsigned int m = p & 0xF;  /* mantissa */
  int e = (p >> 4);  /* exponent */
  if (e > 0) {  /* normalized? */
    e--;  /* correct exponent */
    m += 0x10;  /* correct mantissa; maximum value is 0x1F */
  }
  e -= 7;  /* correct excess-7 */
  if (e >= 0) {
    if (x < (MAX_LMEM / 0x1F) >> e)  /* no overflow? */
      return (x * m) << e;  /* order doesn't matter here */
    else  /* real overflow */
      return MAX_LMEM;
  }
  else {  /* negative exponent */
    e = -e;
    if (x < MAX_LMEM / 0x1F)  /* multiplication cannot overflow? */
      return (x * m) >> e;  /* multiplying first gives more precision */
    else if ((x >> e) <  MAX_LMEM / 0x1F)  /* cannot overflow after shift? */
      return (x >> e) * m;
    else  /* real overflow */
      return MAX_LMEM;
  }
}